

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_multimap_string_Test::TestBody(Btree_multimap_string_Test *this)

{
  pointer pcVar1;
  _Tuple_impl<0UL,_phmap::priv::StringBtreeDefaultLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
  _Var2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RDX;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RDX_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *values;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *values_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *values_01;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RDX_01;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RDX_02;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RDX_03;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RDX_04;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  n;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_06;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_08;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_09;
  size_type n_00;
  int i;
  int iVar9;
  int in_R8D;
  char *pcVar10;
  iterator iter;
  AssertionResult AVar11;
  iterator iter_00;
  multi_checker<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  container;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  random_values;
  int64_t original_bytes1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sorted_values;
  Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generator;
  PropagatingCountingAlloc<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  allocator2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  duplicate_values;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  identical_values;
  AssertHelper local_170;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_168;
  undefined1 local_160 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  undefined1 local_138 [24];
  _Base_ptr local_120;
  size_t local_118;
  undefined1 local_110 [32];
  pointer local_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [32];
  Generator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 local_80 [24];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  Generator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  CountingAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  _Base_ptr local_40;
  pointer local_38;
  
  (anonymous_namespace)::
  ConstTest<phmap::btree_multimap<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            ();
  GenerateValuesWithSeed<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_110,(priv *)0x2710,40000,testing::FLAGS_gtest_random_seed,in_R8D);
  local_150._8_8_ = local_160;
  local_160 = (undefined1  [8])
              &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
               ::EmptyNode()::empty_node_abi_cxx11_;
  local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
               ::EmptyNode()::empty_node_abi_cxx11_;
  local_150._M_allocated_capacity = 0;
  local_138._16_8_ = local_138;
  local_138._0_4_ = _S_red;
  local_138._8_8_ = (_Base_ptr)0x0;
  local_118 = 0;
  local_120 = (_Base_ptr)local_138._16_8_;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_a8,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_110);
  uVar5 = local_a8._8_8_;
  uVar4 = local_a8._0_8_;
  pvVar8 = extraout_RDX;
  if (local_a8._0_8_ != local_a8._8_8_) {
    uVar7 = (long)(local_a8._8_8_ - local_a8._0_8_) >> 6;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a8._0_8_,local_a8._8_8_,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,uVar5);
    pvVar8 = extraout_RDX_00;
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_160,
             (multi_checker<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_a8,pvVar8);
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
            (local_a8._0_8_,local_a8._8_8_);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_160,
             (multi_checker<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_a8,values);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_160,
             (multi_checker<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_110,values_00);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_80,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_110);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>const*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)local_80,local_80._8_8_,local_110._0_8_,local_110._8_8_);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_160,
             (multi_checker<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_80,values_01);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_80 + 0x18),100,(allocator_type *)local_e8);
  local_88.tgen.maxval = 2;
  local_88.ugen.maxval = 2;
  Generator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator()((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8,&local_88,2);
  pvVar8 = extraout_RDX_01;
  for (; local_68.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_68.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_68.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)local_68.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0x40)) {
    std::__cxx11::string::_M_assign
              ((string *)
               local_68.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)local_68.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0x20));
    pvVar8 = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    pvVar8 = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._0_8_ != &local_d8) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
    pvVar8 = extraout_RDX_04;
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_160,
             (multi_checker<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)(local_80 + 0x18),pvVar8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_80 + 0x18));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_80);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_140);
  btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
  ::~btree((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
            *)local_160);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_110);
  local_e8._0_8_ = (ulong)(uint)local_e8._4_4_ << 0x20;
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((string *)local_160,
             (Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_e8,0);
  if (local_160 != (undefined1  [8])&local_150) {
    operator_delete((void *)local_160,local_150._M_allocated_capacity + 1);
  }
  local_80._0_8_ =
       (_Tuple_impl<1UL,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
        )0x0;
  local_a8._24_8_ =
       (btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x3e8000003e8;
  local_a8._0_8_ =
       (_Tuple_impl<1UL,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
        )0x20;
  local_88 = (Generator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )local_80;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8;
  local_38 = (pointer)operator_new(0x20);
  local_80._0_8_ = local_80._0_8_ + 0x20;
  local_40 = (_Base_ptr)operator_new(0x20);
  local_e8._0_8_ =
       &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
        ::EmptyNode()::empty_node_abi_cxx11_;
  local_d8._M_allocated_capacity =
       (size_type)
       &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
        ::EmptyNode()::empty_node_abi_cxx11_;
  local_d8._8_8_ = (_Base_ptr)0x0;
  local_110._0_8_ =
       &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
        ::EmptyNode()::empty_node_abi_cxx11_;
  local_110._16_8_ =
       &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
        ::EmptyNode()::empty_node_abi_cxx11_;
  local_110._24_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f0 = (pointer)local_a8._0_8_;
  local_110._8_8_ = local_80;
  local_e8._8_8_ = local_a8;
  Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator()((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_160,
               (Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_a8 + 0x18),0);
  btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
            *)local_e8,(value_type *)local_160);
  pcVar1 = local_138 + 8;
  if (local_140._M_p != pcVar1) {
    operator_delete(local_140._M_p,(ulong)(local_138._8_8_ + 1));
  }
  if (local_160 != (undefined1  [8])&local_150) {
    operator_delete((void *)local_160,local_150._M_allocated_capacity + 1);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_160,"bytes1","original_bytes1",(long *)local_a8,(long *)&local_f0);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (local_158->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar10);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_168._M_head_impl + 8))();
    }
  }
  if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_158,local_158);
  }
  if ((_Base_ptr)local_d8._8_8_ != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                      *)local_e8,(node_type *)local_e8._0_8_);
  }
  local_e8._0_8_ =
       &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
        ::EmptyNode()::empty_node_abi_cxx11_;
  local_d8._M_allocated_capacity =
       (size_type)
       &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
        ::EmptyNode()::empty_node_abi_cxx11_;
  local_d8._8_8_ = (_Base_ptr)0x0;
  local_e8._8_8_ = local_110._8_8_;
  if ((local_110._0_8_ & 7) != 0) {
    pcVar10 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
    goto LAB_0017209d;
  }
  _Var2.
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*,_false>
  ._M_head_impl =
       *(_Tuple_impl<1UL,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
         *)local_110._0_8_;
  local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((ulong)local_158 & 0xffffffff00000000);
  local_160 = (undefined1  [8])
              _Var2.
              super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*,_false>
              ._M_head_impl;
  if ((local_110._16_8_ & 7) == 0) {
    if ((_Var2.
         super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
         .
         super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
         .
         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*,_false>
         ._M_head_impl ==
         (_Tuple_impl<1UL,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
          )local_110._16_8_) &&
       (*(btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
          *)(local_110._16_8_ + 10) ==
        (btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
         )0x0)) {
LAB_001713ab:
      local_170.data_._0_4_ = 0;
      local_168._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_
      ;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)local_160,"b1.size()","0",(unsigned_long *)&local_168,(int *)&local_170
                );
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2c2,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if ((_Base_ptr)local_168._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      local_168._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_110._24_8_;
      local_170.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)local_160,"b2.size()","0",(unsigned_long *)&local_168,(int *)&local_170
                );
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2c3,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if (local_168._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)local_160,"bytes1","original_bytes1",(long *)local_a8,(long *)&local_f0
                );
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2c4,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if (local_168._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      iVar9 = 1;
      do {
        Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator()((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_160,
                     (Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_a8 + 0x18),iVar9);
        btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
        ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
                  *)local_e8,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_160);
        if (local_140._M_p != pcVar1) {
          operator_delete(local_140._M_p,(ulong)(local_138._8_8_ + 1));
        }
        if (local_160 != (undefined1  [8])&local_150) {
          operator_delete((void *)local_160,local_150._M_allocated_capacity + 1);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != 1000);
      testing::internal::CmpHelperGT<long,long>
                ((internal *)local_160,"bytes2","bytes1",(long *)local_80,(long *)local_a8);
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2cb,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if (local_168._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_110._24_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
        ::internal_clear((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                          *)local_110,(node_type *)local_110._0_8_);
      }
      if ((_Base_ptr)local_d8._8_8_ != (_Base_ptr)0x0) {
        btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
        ::internal_clear((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                          *)local_e8,(node_type *)local_e8._0_8_);
      }
      local_e8._0_8_ =
           &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      local_48.bytes_used_ =
           (int64_t *)
           local_68.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_e8._8_8_ =
           local_68.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_d8._M_allocated_capacity =
           (size_type)
           &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      local_d8._8_8_ = (_Base_ptr)0x0;
      local_110._0_8_ =
           &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      local_50 = local_88;
      local_110._8_4_ = local_88.tgen.maxval;
      local_110._12_4_ = local_88.ugen.maxval;
      local_110._16_8_ =
           &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      local_110._24_8_ = (_Base_ptr)0x0;
      local_f0 = (pointer)local_a8._0_8_;
      Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator()((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_160,
                   (Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_a8 + 0x18),0);
      btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
      ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
                *)local_e8,(value_type *)local_160);
      if (local_140._M_p != pcVar1) {
        operator_delete(local_140._M_p,(ulong)(local_138._8_8_ + 1));
      }
      if (local_160 != (undefined1  [8])&local_150) {
        operator_delete((void *)local_160,local_150._M_allocated_capacity + 1);
      }
      testing::internal::CmpHelperGT<long,long>
                ((internal *)local_160,"bytes1","original_bytes1",(long *)local_a8,(long *)&local_f0
                );
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2d5,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if (local_168._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      if ((_Base_ptr)local_d8._8_8_ != (_Base_ptr)0x0) {
        btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
        ::internal_clear((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                          *)local_e8,(node_type *)local_e8._0_8_);
      }
      local_168._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_110._24_8_;
      uVar4 = local_110._8_8_;
      local_110._8_8_ = local_e8._8_8_;
      local_e8._0_8_ = local_110._0_8_;
      local_e8._8_8_ = uVar4;
      local_110._0_8_ =
           &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      local_d8._M_allocated_capacity = local_110._16_8_;
      local_110._16_8_ =
           &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      local_d8._8_8_ = local_110._24_8_;
      local_110._24_8_ =
           (btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x0;
      local_170.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)local_160,"b1.size()","0",(unsigned_long *)&local_168,(int *)&local_170
                );
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2d9,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if ((_Base_ptr)local_168._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)local_160,"bytes1","original_bytes1",(long *)local_a8,(long *)&local_f0
                );
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2da,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if ((_Base_ptr)local_168._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      iVar9 = 1;
      do {
        Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator()((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_160,
                     (Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_a8 + 0x18),iVar9);
        btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
        ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
                  *)local_e8,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_160);
        if (local_140._M_p != pcVar1) {
          operator_delete(local_140._M_p,(ulong)(local_138._8_8_ + 1));
        }
        if (local_160 != (undefined1  [8])&local_150) {
          operator_delete((void *)local_160,local_150._M_allocated_capacity + 1);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != 1000);
      testing::internal::CmpHelperGT<long,long>
                ((internal *)local_160,"bytes2","bytes1",(long *)local_80,(long *)local_a8);
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2e1,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if ((_Base_ptr)local_168._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      if ((btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_110._24_8_ !=
          (btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x0) {
        btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
        ::internal_clear((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                          *)local_110,(node_type *)local_110._0_8_);
      }
      if ((_Base_ptr)local_d8._8_8_ != (_Base_ptr)0x0) {
        btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
        ::internal_clear((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                          *)local_e8,(node_type *)local_e8._0_8_);
      }
      local_e8._0_8_ =
           &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      local_e8._8_8_ = local_48.bytes_used_;
      local_d8._M_allocated_capacity =
           (size_type)
           &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      local_d8._8_8_ = (_Base_ptr)0x0;
      local_110._0_8_ =
           &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      local_110._8_4_ = local_50.tgen.maxval;
      local_110._12_4_ = local_50.ugen.maxval;
      local_110._16_8_ =
           &btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      local_110._24_8_ = (_Base_ptr)0x0;
      local_f0 = (pointer)local_a8._0_8_;
      Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator()((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_160,
                   (Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_a8 + 0x18),0);
      btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
      ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
                *)local_e8,(value_type *)local_160);
      if (local_140._M_p != pcVar1) {
        operator_delete(local_140._M_p,(ulong)(local_138._8_8_ + 1));
      }
      if (local_160 != (undefined1  [8])&local_150) {
        operator_delete((void *)local_160,local_150._M_allocated_capacity + 1);
      }
      testing::internal::CmpHelperGT<long,long>
                ((internal *)local_160,"bytes1","original_bytes1",(long *)local_a8,(long *)&local_f0
                );
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2eb,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if ((_Base_ptr)local_168._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      uVar6 = local_d8._M_allocated_capacity;
      uVar5 = local_e8._8_8_;
      uVar4 = local_e8._0_8_;
      local_168._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_110._24_8_;
      local_e8._0_8_ = local_110._0_8_;
      local_e8._8_8_ = local_110._8_8_;
      local_110._0_8_ = uVar4;
      local_110._8_8_ = uVar5;
      local_d8._M_allocated_capacity = local_110._16_8_;
      local_110._16_8_ = uVar6;
      local_110._24_8_ = local_d8._8_8_;
      local_d8._8_8_ = local_168._M_head_impl;
      local_170.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)local_160,"b1.size()","0",(unsigned_long *)&local_168,(int *)&local_170
                );
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2ef,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if ((_Base_ptr)local_168._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      local_168._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_110._24_8_;
      local_170.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)local_160,"b2.size()","1",(unsigned_long *)&local_168,(int *)&local_170
                );
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2f0,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if ((_Base_ptr)local_168._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      testing::internal::CmpHelperGT<long,long>
                ((internal *)local_160,"bytes1","original_bytes1",(long *)local_a8,(long *)&local_f0
                );
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2f1,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if ((_Base_ptr)local_168._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
      }
      iVar9 = 1;
      do {
        Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator()((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_160,
                     (Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_a8 + 0x18),iVar9);
        btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
        ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_>
                  *)local_e8,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_160);
        if (local_140._M_p != pcVar1) {
          operator_delete(local_140._M_p,(ulong)(local_138._8_8_ + 1));
        }
        if (local_160 != (undefined1  [8])&local_150) {
          operator_delete((void *)local_160,local_150._M_allocated_capacity + 1);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != 1000);
      AVar11 = testing::internal::CmpHelperGT<long,long>
                         ((internal *)local_160,"bytes2","bytes1",(long *)local_80,(long *)local_a8)
      ;
      n._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar11.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if (local_160[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_158->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x2f8,pcVar10);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        n = extraout_RDX_05.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
        if ((_Base_ptr)local_168._M_head_impl != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_168._M_head_impl + 8))();
          n._M_head_impl = extraout_RDX_06;
        }
      }
      if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_158,local_158);
        n._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX_07.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      }
      if ((_Base_ptr)local_110._24_8_ != (_Base_ptr)0x0) {
        btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
        ::internal_clear((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                          *)local_110,(node_type *)local_110._0_8_);
        n._M_head_impl = extraout_RDX_08;
      }
      if ((_Base_ptr)local_d8._8_8_ != (_Base_ptr)0x0) {
        btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
        ::internal_clear((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                          *)local_e8,(node_type *)local_e8._0_8_);
        n._M_head_impl = extraout_RDX_09._M_head_impl;
      }
      CountingAllocator<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::deallocate((CountingAllocator<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)(local_80 + 0x18),local_38,(size_type)n._M_head_impl);
      CountingAllocator<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::deallocate((CountingAllocator<phmap::btree_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&local_88,(pointer)local_40,n_00);
      return;
    }
    if (((ulong)_Var2.
                super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*,_false>
                ._M_head_impl & 7) != 0) {
LAB_00172088:
      pcVar10 = 
      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
      ;
      goto LAB_0017209d;
    }
    local_e8._0_8_ =
         btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
         ::new_leaf_root_node
                   ((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                     *)local_e8,1);
    local_d8._M_allocated_capacity = local_e8._0_8_;
    iter = btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
           ::internal_upper_bound<std::__cxx11::string>
                     ((btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
                       *)local_e8._0_8_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)_Var2.
                             super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
                             .
                             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
                             .
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*,_false>
                             ._M_head_impl + 0x10U));
    if (iter.node ==
        (btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
         *)0x0) {
      if ((local_d8._M_allocated_capacity & 7) != 0) goto LAB_00171389;
      iter.position._0_1_ = *(node_type *)(local_d8._M_allocated_capacity + 10);
      iter.node = (btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                   *)local_d8._M_allocated_capacity;
      iter._9_7_ = 0;
    }
    btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
    ::internal_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&>
              ((btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
                *)local_e8,iter,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)_Var2.
                         super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
                         .
                         super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*>
                         .
                         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>_*,_false>
                         ._M_head_impl + 0x10U));
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
    ::operator++((btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                  *)local_160);
    if ((local_110._16_8_ & 7) == 0) {
      do {
        if ((local_160 == (undefined1  [8])local_110._16_8_) &&
           ((uint)local_158 == *(byte *)(local_110._16_8_ + 10))) goto LAB_001713ab;
        if ((local_d8._M_allocated_capacity & 7) != 0) break;
        if (((ulong)local_160 & 7) != 0) goto LAB_00172088;
        iter_00.position._0_1_ = *(node_type *)(local_d8._M_allocated_capacity + 10);
        iter_00.node = (btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                        *)local_d8._M_allocated_capacity;
        iter_00._9_7_ = 0;
        btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
        ::internal_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&>
                  ((btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
                    *)local_e8,iter_00,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)local_160 + (long)(int)(uint)local_158 * 0x40 + 0x10));
        btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
        ::operator++((btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                      *)local_160);
      } while ((local_110._16_8_ & 7) == 0);
    }
  }
LAB_00171389:
  pcVar10 = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_0017209d:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,pcVar10);
}

Assistant:

void BtreeMultiTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        multi_checker<T, C> container;

        // Test keys in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test keys in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test keys in random order.
        DoTest("random:    ", &container, random_values);

        // Test keys in random order w/ duplicates.
        std::vector<V> duplicate_values(random_values);
        duplicate_values.insert(duplicate_values.end(), random_values.begin(),
                                random_values.end());
        DoTest("duplicates:", &container, duplicate_values);

        // Test all identical keys.
        std::vector<V> identical_values(100);
        std::fill(identical_values.begin(), identical_values.end(),
                  Generator<V>(2)(2));
        DoTest("identical: ", &container, identical_values);
    }